

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.cpp
# Opt level: O3

void __thiscall
sjtu::UserManager::add_order(UserManager *this,OrderManager *order_manager,orderType *order)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar2;
  locType extraout_RDX;
  long lVar3;
  pair<long,_bool> pVar4;
  allocator local_71;
  OrderManager *local_70;
  long *local_68;
  long local_60;
  long local_58 [2];
  long local_48;
  undefined1 local_40;
  ulong local_38;
  void *__dest;
  
  local_70 = order_manager;
  iVar1 = (*(order_manager->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
            _vptr_FileManager_Base[1])();
  __dest = (void *)CONCAT44(extraout_var,iVar1);
  memcpy(__dest,order,0xb0);
  order->offset = extraout_RDX;
  *(locType *)((long)__dest + 0xb0) = extraout_RDX;
  this_00 = this->UserBpTree;
  std::__cxx11::string::string((string *)&local_68,order->username,&local_71);
  if (local_60 == 0) {
    local_38 = 0;
  }
  else {
    lVar3 = 0;
    lVar2 = 0;
    local_38 = 0;
    do {
      lVar2 = ((long)*(char *)((long)local_68 + lVar3) + lVar2 * 0x239 + 0x100) % 0x3b800001;
      local_38 = (long)((long)*(char *)((long)local_68 + lVar3) + local_38 * 0x301 + 0x100) %
                 0x3b9aca07;
      lVar3 = lVar3 + 1;
    } while (local_60 != lVar3);
    local_38 = lVar2 << 0x20 | local_38;
  }
  pVar4 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (this_00,&local_38);
  local_48 = pVar4.first;
  local_40 = pVar4.second;
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  iVar1 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                    (this->UserFile,&local_48);
  lVar2 = CONCAT44(extraout_var_00,iVar1);
  *(undefined8 *)((long)__dest + 0xb8) = *(undefined8 *)(lVar2 + 0x70);
  *(locType *)(lVar2 + 0x70) = extraout_RDX;
  *(int *)(lVar2 + 0x80) = *(int *)(lVar2 + 0x80) + 1;
  (*(local_70->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
    _vptr_FileManager_Base[3])(local_70->OrderFile,(long)__dest + 0xb0);
  (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])
            (this->UserFile,lVar2 + 0x78);
  return;
}

Assistant:

void UserManager::add_order(OrderManager *order_manager, orderType *order) {
            auto ret = order_manager->OrderFile->newspace();          //std::pair<std::pair<orderType , locType>* , locType>
            ret.first -> first = *order;
            ret.first->first.offset = order -> offset = ret.second;
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(order->username));
            userType *cur = UserFile->read(tmp.first);
            ret.first -> second = cur->head;
            cur->head = ret.second;
            ++cur->order_count;
            order_manager->OrderFile->save(ret.first->first.offset);
            UserFile->save(cur->offset);
        }